

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

char * find_filename_extension(char *fname)

{
  char *local_20;
  char *p;
  char *retval;
  char *fname_local;
  
  p = (char *)0x0;
  if (fname != (char *)0x0) {
    local_20 = strchr(fname,0x2e);
    p = local_20;
    while (local_20 != (char *)0x0) {
      local_20 = strchr(local_20 + 1,0x2e);
      if (local_20 != (char *)0x0) {
        p = local_20;
      }
    }
    if (p != (char *)0x0) {
      p = p + 1;
    }
  }
  return p;
}

Assistant:

static const char *find_filename_extension(const char *fname)
{
    const char *retval = NULL;
    if (fname != NULL)
    {
        const char *p = strchr(fname, '.');
        retval = p;

        while (p != NULL)
        {
            p = strchr(p + 1, '.');
            if (p != NULL)
                retval = p;
        } /* while */

        if (retval != NULL)
            retval++;  /* skip '.' */
    } /* if */

    return retval;
}